

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRUP_Crypto.cpp
# Opt level: O0

void __thiscall SRUP_Crypto::_encrypt(SRUP_Crypto *this,char *__block,int __edflag)

{
  int iVar1;
  EVP_CIPHER_CTX *ctx_00;
  EVP_CIPHER *pEVar2;
  uint8_t *puVar3;
  void *in_RCX;
  ulong uVar4;
  int encrypted_data_size;
  int x;
  EVP_CIPHER_CTX *ctx;
  EVP_PKEY *pkey;
  uint8_t iv [16];
  uint8_t *evp_key;
  uchar local_2048 [4];
  int final_len;
  uint8_t final [4096];
  int local_103c;
  uchar local_1038 [4];
  int body_len;
  uint8_t body [4096];
  int iv_len;
  int evp_key_len;
  RSA *rsa_key_local;
  int input_datasize_local;
  uint8_t *data_local;
  SRUP_Crypto *this_local;
  
  iv[8] = '\0';
  iv[9] = '\0';
  iv[10] = '\0';
  iv[0xb] = '\0';
  iv[0xc] = '\0';
  iv[0xd] = '\0';
  iv[0xe] = '\0';
  iv[0xf] = '\0';
  ctx = (EVP_CIPHER_CTX *)EVP_PKEY_new();
  iVar1 = EVP_PKEY_assign((EVP_PKEY *)ctx,6,in_RCX);
  if (iVar1 == 0) {
    EVP_PKEY_free((EVP_PKEY *)ctx);
  }
  else {
    ctx_00 = EVP_CIPHER_CTX_new();
    EVP_CIPHER_CTX_reset(ctx_00);
    iVar1 = EVP_PKEY_get_size(ctx);
    uVar4 = (ulong)iVar1;
    if ((long)uVar4 < 0) {
      uVar4 = 0xffffffffffffffff;
    }
    iv._8_8_ = operator_new__(uVar4);
    pEVar2 = EVP_aes_256_cbc();
    iVar1 = EVP_SealInit(ctx_00,pEVar2,(uchar **)(iv + 8),(int *)(body + 0xffc),(uchar *)&pkey,
                         (EVP_PKEY **)&ctx,1);
    if (iVar1 == 0) {
      EVP_PKEY_free((EVP_PKEY *)ctx);
      EVP_CIPHER_CTX_free(ctx_00);
      if (iv._8_8_ != 0) {
        operator_delete__((void *)iv._8_8_);
      }
    }
    else {
      iVar1 = EVP_EncryptUpdate(ctx_00,local_1038,&local_103c,(uchar *)__block,__edflag);
      if (iVar1 == 0) {
        EVP_PKEY_free((EVP_PKEY *)ctx);
        EVP_CIPHER_CTX_free(ctx_00);
        if (iv._8_8_ != 0) {
          operator_delete__((void *)iv._8_8_);
        }
      }
      else {
        iVar1 = EVP_SealFinal(ctx_00,local_2048,(int *)((long)&evp_key + 4));
        if (iVar1 == 0) {
          EVP_PKEY_free((EVP_PKEY *)ctx);
          EVP_CIPHER_CTX_free(ctx_00);
          if (iv._8_8_ != 0) {
            operator_delete__((void *)iv._8_8_);
          }
        }
        else {
          pEVar2 = EVP_aes_256_cbc();
          body._4088_4_ = EVP_CIPHER_get_iv_length(pEVar2);
          this->m_crypt_length =
               (short)body._4092_4_ + (short)body._4088_4_ + 0xc + (short)local_103c +
               (short)evp_key._4_4_;
          if (this->m_crypt != (uint8_t *)0x0) {
            operator_delete__(this->m_crypt);
          }
          puVar3 = (uint8_t *)operator_new__((ulong)this->m_crypt_length);
          this->m_crypt = puVar3;
          *(undefined4 *)this->m_crypt = body._4092_4_;
          memcpy(this->m_crypt + 4,(void *)iv._8_8_,(long)(int)body._4092_4_);
          memcpy(this->m_crypt + (body._4092_4_ + 4),&pkey,(long)(int)body._4088_4_);
          iVar1 = body._4088_4_ + body._4092_4_ + 4;
          *(int *)(this->m_crypt + iVar1) = local_103c + evp_key._4_4_;
          *(int *)(this->m_crypt + (iVar1 + 4)) = __edflag;
          memcpy(this->m_crypt + (iVar1 + 8),local_1038,(long)local_103c);
          memcpy(this->m_crypt + (local_103c + iVar1 + 8),local_2048,(long)evp_key._4_4_);
          EVP_PKEY_free((EVP_PKEY *)ctx);
          EVP_CIPHER_CTX_free(ctx_00);
          if (iv._8_8_ != 0) {
            operator_delete__((void *)iv._8_8_);
          }
        }
      }
    }
  }
  return;
}

Assistant:

bool SRUP_Crypto::_encrypt(uint8_t *data, int input_datasize, RSA *rsa_key)
{
    int evp_key_len;
    int iv_len;

    uint8_t body[4096];
    int body_len;

    uint8_t final[4096];
    int final_len;

    uint8_t* evp_key = nullptr;
    uint8_t iv[EVP_MAX_IV_LENGTH];

    EVP_PKEY *pkey;
    EVP_CIPHER_CTX* ctx;

    pkey = EVP_PKEY_new();

    // Next we need to assign the "envelope key" & init...
    if (!EVP_PKEY_assign_RSA(pkey, rsa_key))
    {
        EVP_PKEY_free(pkey);
        return false;
    }

    ctx = EVP_CIPHER_CTX_new();

    EVP_CIPHER_CTX_init(ctx);
    evp_key = new uint8_t[EVP_PKEY_size(pkey)];
    if (!EVP_SealInit(ctx, EVP_aes_256_cbc(), &evp_key, &evp_key_len, iv, &pkey, 1))
    {
        EVP_PKEY_free(pkey);
        EVP_CIPHER_CTX_free(ctx);
        delete[] evp_key;
        return false;
    }

    // Having initialized (generated the initialization vector (iv) and the symmetric key we next do the encryption
    if (!EVP_SealUpdate(ctx, body, &body_len, data, input_datasize))
    {
        EVP_PKEY_free(pkey);
        EVP_CIPHER_CTX_free(ctx);
        delete[] evp_key;
        return false;
    }

    // We finish with EVP_SealFinal to take care of any padding
    if (!EVP_SealFinal(ctx, final, &final_len))
    {
        EVP_PKEY_free(pkey);
        EVP_CIPHER_CTX_free(ctx);
        delete[] evp_key;
        return false;
    }

    // Lastly we need to write the encrypted (symmetric) key length, the encrypted (symmetric) key; and the
    // initialization vector to the return value...along with the encrypted version of the data.

    // We start by calculating the size of the return value.
    iv_len = EVP_CIPHER_iv_length(EVP_aes_256_cbc());

    // The crypt length is equal to:
    // key length (sizeof(int)=4) + key length + IV length + data size (sizeof(int)=4)) +
    // input data size (sizeof(int)=4)) + data (body + final (including padding))
    m_crypt_length = sizeof(int) + evp_key_len + iv_len + sizeof(int) + sizeof(int) + body_len + final_len;

    delete[] m_crypt;
    m_crypt = new uint8_t[m_crypt_length];

    int x=0;

    // Now we're ready to write the encrypted data to m_crypt...
    // The order here is:
    //
    // encrypted (symmetric) key length
    std::memcpy(m_crypt, &evp_key_len, sizeof(int));
    x+=sizeof(int);

    // encrypted (symmetric) key
    std::memcpy(m_crypt+x, evp_key, (size_t) evp_key_len);
    x+=evp_key_len;

    // initialization vector (this has a fixed length – so we don't need to store it)
    std::memcpy(m_crypt+x, iv, (size_t) iv_len);
    x+=iv_len;

    // encrypted data size
    int encrypted_data_size = body_len + final_len;
    std::memcpy(m_crypt+x, &encrypted_data_size, sizeof(int));
    x+=sizeof(int);

    // Now the unencrypted data size (so we can reconstruct the data on the other side)
    std::memcpy(m_crypt+x, &input_datasize, sizeof(int));
    x+=sizeof(int);

    // And finally the encrypted data – first the main block of encrypted data...
    std::memcpy(m_crypt+x, body, (size_t) body_len);
    x+=body_len;

    // ...then the final data block (including any padding)
    // NOTE: this rather assumes that we'll never get data larger than 128-bytes. We'll need to change this if we're
    // expecting that not to be the case.
    std::memcpy(m_crypt+x, final, (size_t) final_len);

    EVP_PKEY_free(pkey);
    EVP_CIPHER_CTX_free(ctx);
    delete[] evp_key;

    return true;
}